

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chimera.hpp
# Opt level: O2

ChimeraIndex * __thiscall
openjij::graph::Chimera<double>::to_rci
          (ChimeraIndex *__return_storage_ptr__,Chimera<double> *this,Index ind)

{
  runtime_error *this_00;
  ulong uVar1;
  string sStack_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if (ind < (this->super_Sparse<double>).super_Graph._num_spins) {
    uVar1 = this->_num_column << 3;
    (__return_storage_ptr__->super__Tuple_impl<0UL,_unsigned_long,_unsigned_long,_unsigned_long>).
    super__Tuple_impl<1UL,_unsigned_long,_unsigned_long>.super__Tuple_impl<2UL,_unsigned_long>.
    super__Head_base<2UL,_unsigned_long,_false>._M_head_impl = (ulong)((uint)ind & 7);
    (__return_storage_ptr__->super__Tuple_impl<0UL,_unsigned_long,_unsigned_long,_unsigned_long>).
    super__Tuple_impl<1UL,_unsigned_long,_unsigned_long>.super__Head_base<1UL,_unsigned_long,_false>
    ._M_head_impl = ind % uVar1 >> 3;
    (__return_storage_ptr__->super__Tuple_impl<0UL,_unsigned_long,_unsigned_long,_unsigned_long>).
    super__Head_base<0UL,_unsigned_long,_false>._M_head_impl = ind / uVar1;
    return __return_storage_ptr__;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::to_string(&sStack_78,ind);
  std::operator+(&local_58,"invalid value index=",&sStack_78);
  std::operator+(&local_38,&local_58," inserted in Chimera");
  std::runtime_error::runtime_error(this_00,(string *)&local_38);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

ChimeraIndex to_rci(Index ind) const {
    if (!(ind < this->get_num_spins())) {
      throw std::runtime_error("invalid value index=" + std::to_string(ind) +
                               " inserted in Chimera");
    }

    std::int64_t r = ind / (_num_column * _num_in_chimera);
    ind -= (_num_column * _num_in_chimera) * r;
    std::int64_t c = ind / _num_in_chimera;
    ind -= (_num_in_chimera)*c;
    std::int64_t i = ind;
    return std::make_tuple(r, c, i);
  }